

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O2

Cov_Man_t * Cov_ManAlloc(Abc_Ntk_t *pNtk,int nFaninMax,int nCubesMax)

{
  uint uVar1;
  Cov_Man_t *pCVar2;
  Vec_Int_t *pVVar3;
  void *__s;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  ulong uVar6;
  void *pvVar7;
  Min_Man_t *pMVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int Entry;
  
  if (pNtk->pManCut != (void *)0x0) {
    __assert_fail("pNtk->pManCut == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMan.c"
                  ,0x33,"Cov_Man_t *Cov_ManAlloc(Abc_Ntk_t *, int, int)");
  }
  Entry = 0x78;
  pCVar2 = (Cov_Man_t *)calloc(1,0x78);
  pCVar2->nFaninMax = nFaninMax;
  pCVar2->nCubesMax = nCubesMax;
  pCVar2->nWords = ((nFaninMax >> 4) + 1) - (uint)((nFaninMax & 0xfU) == 0);
  pVVar3 = Vec_IntAlloc(nFaninMax * 2);
  pCVar2->vComTo0 = pVVar3;
  pVVar3 = Vec_IntAlloc(nFaninMax * 2);
  pCVar2->vComTo1 = pVVar3;
  pVVar3 = Vec_IntAlloc(nFaninMax);
  pCVar2->vPairs0 = pVVar3;
  pVVar3 = Vec_IntAlloc(nFaninMax);
  pCVar2->vPairs1 = pVVar3;
  pVVar3 = Vec_IntAlloc(1);
  pCVar2->vTriv0 = pVVar3;
  Vec_IntPush(pVVar3,Entry);
  pVVar3 = Vec_IntAlloc(1);
  pCVar2->vTriv1 = pVVar3;
  Vec_IntPush(pVVar3,Entry);
  uVar1 = pNtk->vObjs->nSize;
  lVar11 = (long)(int)uVar1;
  __s = malloc(lVar11 << 10);
  pCVar2->pMemory = __s;
  memset(__s,0,lVar11 << 5);
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar1 - 1) {
    uVar10 = uVar1;
  }
  pVVar4->nCap = uVar10;
  if (uVar10 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar10 << 3);
  }
  pVVar4->pArray = ppvVar5;
  pCVar2->vObjStrs = pVVar4;
  if ((int)uVar10 < (int)uVar1) {
    if (ppvVar5 == (void **)0x0) {
      ppvVar5 = (void **)malloc(lVar11 << 3);
    }
    else {
      ppvVar5 = (void **)realloc(ppvVar5,lVar11 << 3);
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nCap = uVar1;
  }
  uVar6 = 0;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    pVVar4->pArray[uVar6] = (void *)0x0;
  }
  pVVar4->nSize = uVar1;
  lVar11 = 0;
  do {
    if (pNtk->vObjs->nSize <= lVar11) {
      pMVar8 = Min_ManAlloc(nFaninMax);
      pCVar2->pManMin = pMVar8;
      return pCVar2;
    }
    pvVar7 = Vec_PtrEntry(pNtk->vObjs,(int)lVar11);
    if (pvVar7 != (void *)0x0) {
      if (pVVar4->nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      pVVar4->pArray[lVar11] = __s;
    }
    lVar11 = lVar11 + 1;
    __s = (void *)((long)__s + 0x20);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cov_Man_t * Cov_ManAlloc( Abc_Ntk_t * pNtk, int nFaninMax, int nCubesMax )
{
    Cov_Man_t * pMan;
    Cov_Obj_t * pMem;
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->pManCut == NULL );

    // start the manager
    pMan = ABC_ALLOC( Cov_Man_t, 1 );
    memset( pMan, 0, sizeof(Cov_Man_t) );
    pMan->nFaninMax = nFaninMax;
    pMan->nCubesMax = nCubesMax;
    pMan->nWords    = Abc_BitWordNum( nFaninMax * 2 );

    // get the cubes
    pMan->vComTo0 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vComTo1 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vPairs0 = Vec_IntAlloc( nFaninMax );
    pMan->vPairs1 = Vec_IntAlloc( nFaninMax );
    pMan->vTriv0  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv0, -1 ); 
    pMan->vTriv1  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv1, -1 ); 

    // allocate memory for object structures
    pMan->pMemory = pMem = ABC_ALLOC( Cov_Obj_t, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    memset( pMem, 0, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    // allocate storage for the pointers to the memory
    pMan->vObjStrs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrFill( pMan->vObjStrs, Abc_NtkObjNumMax(pNtk), NULL );
    Abc_NtkForEachObj( pNtk, pObj, i )
        Vec_PtrWriteEntry( pMan->vObjStrs, i, pMem + i );
    // create the cube manager
    pMan->pManMin = Min_ManAlloc( nFaninMax );
    return pMan;
}